

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppendNew(sqlite3 *db,Expr *pExpr)

{
  sqlite3 *in_RSI;
  ExprList *pList;
  ExprList_item *pItem;
  sqlite3 *db_00;
  ExprList *local_8;
  
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  local_8 = (ExprList *)sqlite3DbMallocRawNN(in_RSI,0xaaaaaaaaaaaaaaaa);
  if (local_8 == (ExprList *)0x0) {
    sqlite3ExprDelete(db_00,(Expr *)0x0);
    local_8 = (ExprList *)0x0;
  }
  else {
    local_8->nAlloc = 4;
    local_8->nExpr = 1;
    local_8->a[0].pExpr = (Expr *)0x0;
    local_8->a[0].zEName = (char *)0x0;
    local_8->a[0].fg = (anon_struct_4_9_b482b7ef_for_fg)0x0;
    local_8->a[0].u = (anon_union_4_2_6146edf4_for_u)0x0;
    local_8->a[0].pExpr = (Expr *)in_RSI;
  }
  return local_8;
}

Assistant:

ExprList *sqlite3ExprListAppendNew(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pList;

  pList = sqlite3DbMallocRawNN(db, sizeof(ExprList)+sizeof(pList->a[0])*4 );
  if( pList==0 ){
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }
  pList->nAlloc = 4;
  pList->nExpr = 1;
  pItem = &pList->a[0];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}